

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_partition_iterator.h
# Opt level: O1

void __thiscall
Gudhi::coxeter_triangulation::Set_partition_iterator::Set_partition_iterator
          (Set_partition_iterator *this,uint *n,uint *k)

{
  uint uVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar2;
  iterator iVar3;
  pointer puVar4;
  pointer puVar5;
  uint uVar6;
  uint i;
  uint local_40;
  allocator_type local_3b;
  allocator_type local_3a;
  allocator_type local_39;
  uint local_38;
  value_type_conflict3 local_34;
  
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->value_,(ulong)*k,&local_39);
  local_34 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->rgs_,(ulong)*n,&local_34,&local_3a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->max_,(ulong)(*n + 1),&local_3b);
  uVar1 = *n;
  this->is_end_ = uVar1 == 0;
  this->n_ = uVar1;
  this->k_ = *k;
  *(this->max_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0xffffffff;
  local_38 = 0;
  do {
    pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
             (this->value_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3._M_current = *(uint **)(pvVar2 + 8);
    if (iVar3._M_current == *(uint **)(pvVar2 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (pvVar2,iVar3,&local_38);
    }
    else {
      *iVar3._M_current = local_38;
      *(uint **)(pvVar2 + 8) = iVar3._M_current + 1;
    }
    local_38 = local_38 + 1;
  } while (local_38 <= *n - *k);
  local_40 = (*n - *k) + 1;
  if (local_40 < *n) {
    uVar6 = 1;
    do {
      (this->rgs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[local_40] = uVar6;
      pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
               ((this->value_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar6);
      iVar3._M_current = *(uint **)(pvVar2 + 8);
      if (iVar3._M_current == *(uint **)(pvVar2 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar3,&local_40);
      }
      else {
        *iVar3._M_current = local_40;
        *(uint **)(pvVar2 + 8) = iVar3._M_current + 1;
      }
      local_40 = local_40 + 1;
      uVar6 = uVar6 + 1;
    } while (local_40 < *n);
  }
  if (*n != 0) {
    puVar4 = (this->rgs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (this->max_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 1;
    do {
      puVar5[uVar6] = puVar4[uVar6 - 1] + 1;
      uVar6 = uVar6 + 1;
    } while (uVar6 <= *n);
  }
  update_value(this);
  return;
}

Assistant:

Set_partition_iterator(const uint& n, const uint& k)
      : value_(k), rgs_(n, 0), max_(n + 1), is_end_(n == 0), n_(n), k_(k) {
    max_[0] = std::numeric_limits<uint>::max();
    for (uint i = 0; i <= n - k; ++i) value_[0].push_back(i);
    for (uint i = n - k + 1, j = 1; i < n; ++i, ++j) {
      rgs_[i] = j;
      value_[j].push_back(i);
    }
    for (uint i = 1; i <= n; i++) max_[i] = rgs_[i - 1] + 1;
    update_value();
  }